

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O1

void __thiscall
duckdb::CSVReaderOptions::Verify(CSVReaderOptions *this,MultiFileOptions *file_options)

{
  bool bVar1;
  ulong uVar2;
  BinderException *pBVar3;
  string local_40;
  
  bVar1 = (this->rejects_table_name).set_by_user;
  if (((bVar1 == true) && ((this->store_rejects).value == false)) &&
     ((this->store_rejects).set_by_user == true)) {
    pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "REJECTS_TABLE option is only supported when store_rejects is not manually set to false"
               ,"");
    BinderException::BinderException(pBVar3,&local_40);
    __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((this->rejects_scan_name).set_by_user == true) {
    if (((this->store_rejects).value == false) && ((this->store_rejects).set_by_user == true)) {
      pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "REJECTS_SCAN option is only supported when store_rejects is not manually set to false"
                 ,"");
      BinderException::BinderException(pBVar3,&local_40);
      __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else if (bVar1 == false) goto LAB_00bc1119;
  if ((this->store_rejects).set_by_user == false) {
    (this->store_rejects).set_by_user = false;
    (this->store_rejects).value = true;
  }
LAB_00bc1119:
  if ((this->store_rejects).value == true) {
    if (((this->ignore_errors).value == false) && ((this->ignore_errors).set_by_user == true)) {
      pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "STORE_REJECTS option is only supported when IGNORE_ERRORS is not manually set to false"
                 ,"");
      BinderException::BinderException(pBVar3,&local_40);
      __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->ignore_errors).set_by_user == false) {
      (this->ignore_errors).set_by_user = false;
      (this->ignore_errors).value = true;
    }
    if (file_options->union_by_name == true) {
      pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "REJECTS_TABLE option is not supported when UNION_BY_NAME is set to true","");
      BinderException::BinderException(pBVar3,&local_40);
      __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  if ((this->rejects_limit != 0) && ((this->store_rejects).value == false)) {
    pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "REJECTS_LIMIT option is only supported when REJECTS_TABLE is set to a table name",""
              );
    BinderException::BinderException(pBVar3,&local_40);
    __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = (this->buffer_size_option).set_by_user;
  if ((bVar1 == true) && ((this->maximum_line_size).set_by_user == true)) {
    if ((this->buffer_size_option).value < (this->maximum_line_size).value) {
      pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "BUFFER_SIZE option was set to %d, while MAX_LINE_SIZE was set to %d. BUFFER_SIZE must have always be set to value bigger than MAX_LINE_SIZE"
                 ,"");
      BinderException::BinderException<unsigned_long,unsigned_long>
                (pBVar3,&local_40,(this->buffer_size_option).value,(this->maximum_line_size).value);
      __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else if (((this->maximum_line_size).set_by_user == true) &&
          (uVar2 = (this->maximum_line_size).value, 2000000 < uVar2 && bVar1 == false)) {
    (this->buffer_size_option).value = uVar2 << 4;
    (this->buffer_size_option).set_by_user = false;
  }
  return;
}

Assistant:

void CSVReaderOptions::Verify(MultiFileOptions &file_options) {
	if (rejects_table_name.IsSetByUser() && !store_rejects.GetValue() && store_rejects.IsSetByUser()) {
		throw BinderException("REJECTS_TABLE option is only supported when store_rejects is not manually set to false");
	}
	if (rejects_scan_name.IsSetByUser() && !store_rejects.GetValue() && store_rejects.IsSetByUser()) {
		throw BinderException("REJECTS_SCAN option is only supported when store_rejects is not manually set to false");
	}
	if (rejects_scan_name.IsSetByUser() || rejects_table_name.IsSetByUser()) {
		// Ensure we set store_rejects to true automagically
		store_rejects.Set(true, false);
	}
	// Validate rejects_table options
	if (store_rejects.GetValue()) {
		if (!ignore_errors.GetValue() && ignore_errors.IsSetByUser()) {
			throw BinderException(
			    "STORE_REJECTS option is only supported when IGNORE_ERRORS is not manually set to false");
		}
		// Ensure we set ignore errors to true automagically
		ignore_errors.Set(true, false);
		if (file_options.union_by_name) {
			throw BinderException("REJECTS_TABLE option is not supported when UNION_BY_NAME is set to true");
		}
	}
	if (rejects_limit != 0 && !store_rejects.GetValue()) {
		throw BinderException("REJECTS_LIMIT option is only supported when REJECTS_TABLE is set to a table name");
	}
	// Validate CSV Buffer and max_line_size do not conflict.
	if (buffer_size_option.IsSetByUser() && maximum_line_size.IsSetByUser()) {
		if (buffer_size_option.GetValue() < maximum_line_size.GetValue()) {
			throw BinderException("BUFFER_SIZE option was set to %d, while MAX_LINE_SIZE was set to %d. BUFFER_SIZE "
			                      "must have always be set to value bigger than MAX_LINE_SIZE",
			                      buffer_size_option.GetValue(), maximum_line_size.GetValue());
		}
	} else if (maximum_line_size.IsSetByUser() && maximum_line_size.GetValue() > max_line_size_default) {
		// If the max line size is set by the user and bigger than we have by default, we make it part of our buffer
		// size decision.
		buffer_size_option.Set(CSVBuffer::ROWS_PER_BUFFER * maximum_line_size.GetValue(), false);
	}
}